

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::PointAccelerationLocalToParent
          (ChVector<double> *__return_storage_ptr__,ChFrameMoving<double> *this,
          ChVector<double> *localpos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChVector<double> *v;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChQuaternion<double> local_128;
  ChQuaternion<double> local_108;
  ChQuaternion<double> local_e8;
  ChQuaternion<double> local_c8;
  ChQuaternion<double> local_a8;
  ChQuaternion<double> local_88;
  ChQuaternion<double> local_68;
  ChQuaternion<double> local_48;
  
  local_88.m_data[0] = 0.0;
  local_88.m_data[1] = localpos->m_data[0];
  local_88.m_data[2] = localpos->m_data[1];
  local_88.m_data[3] = localpos->m_data[2];
  ChQuaternion<double>::operator%(&local_68,&(this->coord_dtdt).rot,&local_88);
  local_a8.m_data[0] = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar4._0_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar4._8_4_ = 0;
  auVar4._12_4_ = 0x80000000;
  local_a8.m_data[1]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 1);
  local_a8.m_data[2]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 2);
  local_a8.m_data[1]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0xc) ^ 0x80000000;
  local_a8.m_data[2]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0x14) ^ 0x80000000;
  local_a8.m_data[3] = (double)vmovlps_avx(auVar4);
  ChQuaternion<double>::operator%(&local_48,&local_68,&local_a8);
  dVar1 = (this->coord_dtdt).pos.m_data[2];
  local_108.m_data[0] = 0.0;
  local_108.m_data[1] = localpos->m_data[0];
  local_108.m_data[2] = localpos->m_data[1];
  local_108.m_data[3] = localpos->m_data[2];
  dVar2 = (this->coord_dtdt).pos.m_data[0];
  dVar3 = (this->coord_dtdt).pos.m_data[1];
  ChQuaternion<double>::operator%(&local_e8,&(this->coord_dt).rot,&local_108);
  local_128.m_data[0] = (this->coord_dt).rot.m_data[0];
  auVar5._0_8_ = -(this->coord_dt).rot.m_data[3];
  auVar5._8_4_ = 0;
  auVar5._12_4_ = 0x80000000;
  local_128.m_data[1]._0_4_ = *(undefined4 *)((this->coord_dt).rot.m_data + 1);
  local_128.m_data[2]._0_4_ = *(undefined4 *)((this->coord_dt).rot.m_data + 2);
  local_128.m_data[1]._4_4_ = *(uint *)((long)(this->coord_dt).rot.m_data + 0xc) ^ 0x80000000;
  local_128.m_data[2]._4_4_ = *(uint *)((long)(this->coord_dt).rot.m_data + 0x14) ^ 0x80000000;
  local_128.m_data[3] = (double)vmovlps_avx(auVar5);
  ChQuaternion<double>::operator%(&local_c8,&local_e8,&local_128);
  __return_storage_ptr__->m_data[0] =
       local_c8.m_data[1] + local_c8.m_data[1] + local_48.m_data[1] + local_48.m_data[1] + dVar2;
  __return_storage_ptr__->m_data[1] =
       local_c8.m_data[2] + local_c8.m_data[2] + local_48.m_data[2] + local_48.m_data[2] + dVar3;
  __return_storage_ptr__->m_data[2] =
       local_c8.m_data[3] + local_c8.m_data[3] + local_48.m_data[3] + local_48.m_data[3] + dVar1;
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> PointAccelerationLocalToParent(const ChVector<Real>& localpos) const {
        return coord_dtdt.pos +
               ((coord_dtdt.rot % ChQuaternion<Real>(0, localpos) % this->coord.rot.GetConjugate()).GetVector() * 2) +
               ((coord_dt.rot % ChQuaternion<Real>(0, localpos) % coord_dt.rot.GetConjugate()).GetVector() * 2);
    }